

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSeparateArgumentsCommand.cxx
# Opt level: O0

bool cmSeparateArgumentsCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  string_view sVar1;
  cmExecutionStatus *pcVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  Arguments AVar6;
  const_reference name;
  size_type sVar7;
  cmMakefile *pcVar8;
  string *psVar9;
  cmArgumentParser<Arguments> *pcVar10;
  reference pvVar11;
  ulong uVar12;
  char *pcVar13;
  iterator iVar14;
  iterator iVar15;
  static_string_view sVar16;
  string_view local_4a0;
  string_view local_490;
  undefined1 local_480 [8];
  string value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_448;
  undefined1 local_430 [8];
  string result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  cmAlphaNum local_3e8;
  cmAlphaNum local_3b8;
  string local_388;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_368;
  string local_348;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_328;
  string local_310;
  string_view local_2f0;
  string local_2e0;
  undefined1 local_2c0 [8];
  string programArgs;
  string program;
  string *command;
  allocator<char> local_251;
  string local_250;
  allocator<char> local_229;
  string local_228;
  allocator<char> local_201;
  string local_200;
  undefined4 local_1e0;
  allocator<char> local_1d9;
  string local_1d8;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_1b8;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_1a8;
  uint local_195;
  byte local_191;
  undefined1 local_190 [3];
  Arguments arguments;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unparsedArguments;
  cmArgumentParser<Arguments> local_128;
  string_view local_b0;
  char local_9a [2];
  char *local_98;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  string local_88 [8];
  string value_1;
  cmValue def;
  string *var;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  pcVar2 = local_20;
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"must be given at least one argument.",&local_41);
    cmExecutionStatus::SetError(pcVar2,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
  }
  else {
    name = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)status_local);
    sVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)status_local);
    if (sVar7 == 1) {
      pcVar8 = cmExecutionStatus::GetMakefile(local_20);
      value_1.field_2._8_8_ = cmMakefile::GetDefinition(pcVar8,name);
      bVar3 = cmValue::operator_cast_to_bool((cmValue *)((long)&value_1.field_2 + 8));
      if (bVar3) {
        psVar9 = cmValue::operator*[abi_cxx11_((cmValue *)((long)&value_1.field_2 + 8));
        std::__cxx11::string::string(local_88,(string *)psVar9);
        local_90._M_current = (char *)std::__cxx11::string::begin();
        local_98 = (char *)std::__cxx11::string::end();
        local_9a[1] = 0x20;
        local_9a[0] = ';';
        std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                  (local_90,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             )local_98,local_9a + 1,local_9a);
        pcVar8 = cmExecutionStatus::GetMakefile(local_20);
        local_b0 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_88);
        cmMakefile::AddDefinition(pcVar8,name,local_b0);
        std::__cxx11::string::~string(local_88);
      }
      args_local._7_1_ = 1;
    }
    else {
      if ((cmSeparateArgumentsCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
           ::parser == '\0') &&
         (iVar5 = __cxa_guard_acquire(&cmSeparateArgumentsCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                       ::parser), iVar5 != 0)) {
        local_128.super_Base.Bindings.Positions.
        super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
        .
        super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_128.super_Base.Bindings.Positions.
        super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
        .
        super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_128.super_Base.Bindings.ParsedKeyword._M_invoker = (_Invoker_type)0x0;
        local_128.super_Base.Bindings.Positions.
        super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
        .
        super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_128.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._8_8_ = 0;
        local_128.super_Base.Bindings.ParsedKeyword.super__Function_base._M_manager =
             (_Manager_type)0x0;
        local_128.super_Base.Bindings.KeywordMissingValue._M_invoker = (_Invoker_type)0x0;
        local_128.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._M_unused.
        _M_object = (void *)0x0;
        local_128.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._8_8_ = 0;
        local_128.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_manager =
             (_Manager_type)0x0;
        local_128.super_Base.Bindings.Keywords.
        super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
        .
        super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_128.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._M_unused.
        _M_object = (void *)0x0;
        local_128.super_Base.Bindings.Keywords.
        super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
        .
        super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_128.super_Base.Bindings.Keywords.
        super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
        .
        super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        cmArgumentParser<Arguments>::cmArgumentParser(&local_128);
        sVar16 = cm::operator____s("UNIX_COMMAND",0xc);
        pcVar10 = cmArgumentParser<Arguments>::Bind<bool>(&local_128,sVar16,0);
        sVar16 = cm::operator____s("WINDOWS_COMMAND",0xf);
        pcVar10 = cmArgumentParser<Arguments>::Bind<bool>(pcVar10,sVar16,1);
        sVar16 = cm::operator____s("NATIVE_COMMAND",0xe);
        pcVar10 = cmArgumentParser<Arguments>::Bind<bool>(pcVar10,sVar16,2);
        sVar16 = cm::operator____s("PROGRAM",7);
        pcVar10 = cmArgumentParser<Arguments>::Bind<bool>(pcVar10,sVar16,3);
        sVar16 = cm::operator____s("SEPARATE_ARGS",0xd);
        pcVar10 = cmArgumentParser<Arguments>::Bind<bool>(pcVar10,sVar16,4);
        cmArgumentParser<Arguments>::cmArgumentParser(&cmSeparateArgumentsCommand::parser,pcVar10);
        cmArgumentParser<Arguments>::~cmArgumentParser(&local_128);
        __cxa_atexit(cmArgumentParser<Arguments>::~cmArgumentParser,
                     &cmSeparateArgumentsCommand::parser,&__dso_handle);
        __cxa_guard_release(&cmSeparateArgumentsCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                             ::parser);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_190);
      local_1b8 = cmMakeRange<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)status_local);
      local_1a8 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ::advance(&local_1b8,1);
      AVar6 = cmArgumentParser<cmSeparateArgumentsCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              ::
              Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                        ((cmArgumentParser<cmSeparateArgumentsCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                          *)&cmSeparateArgumentsCommand::parser,&local_1a8,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_190,0);
      pcVar2 = local_20;
      local_195 = AVar6._0_4_;
      local_191 = AVar6.SeparateArgs;
      if (((((uint5)AVar6 & 1) == 0) && (((uint5)AVar6 & 0x100) == 0)) &&
         (((uint5)AVar6 & 0x10000) == 0)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1d8,
                   "missing required option: \'UNIX_COMMAND\' or \'WINDOWS_COMMAND\' or \'NATIVE_COMMAND\'"
                   ,&local_1d9);
        cmExecutionStatus::SetError(pcVar2,&local_1d8);
        std::__cxx11::string::~string((string *)&local_1d8);
        std::allocator<char>::~allocator(&local_1d9);
        args_local._7_1_ = 0;
        local_1e0 = 1;
      }
      else if ((((((uint5)AVar6 & 1) == 0) || (((uint5)AVar6 & 0x100) == 0)) &&
               ((((uint5)AVar6 & 1) == 0 || (((uint5)AVar6 & 0x10000) == 0)))) &&
              ((((uint5)AVar6 & 0x100) == 0 || (((uint5)AVar6 & 0x10000) == 0)))) {
        if ((((uint5)AVar6 & 0x100000000) == 0) || (((uint5)AVar6 & 0x1000000) != 0)) {
          sVar7 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_190);
          pcVar2 = local_20;
          if (sVar7 < 2) {
            bVar3 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_190);
            if (bVar3) {
              pcVar8 = cmExecutionStatus::GetMakefile(local_20);
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)&command);
              cmMakefile::AddDefinition(pcVar8,name,_command);
              args_local._7_1_ = 1;
              local_1e0 = 1;
            }
            else {
              pvVar11 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_190);
              uVar12 = std::__cxx11::string::empty();
              if ((uVar12 & 1) == 0) {
                if (((local_195 & 0x1000000) == 0) || ((local_191 & 1) != 0)) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)((long)&result.field_2 + 8));
                  if ((local_195 & 0x10000) != 0) {
                    local_195 = CONCAT31(local_195._1_3_,1);
                  }
                  if ((local_195 & 1) == 0) {
                    pcVar13 = (char *)std::__cxx11::string::c_str();
                    cmSystemTools::ParseWindowsCommandLine
                              (pcVar13,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)((long)&result.field_2 + 8));
                  }
                  else {
                    pcVar13 = (char *)std::__cxx11::string::c_str();
                    cmSystemTools::ParseUnixCommandLine
                              (pcVar13,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)((long)&result.field_2 + 8));
                  }
                  if ((local_195 & 0x1000000) != 0) {
                    pvVar11 = std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)((long)&result.field_2 + 8));
                    bVar3 = cmsys::SystemTools::FileExists(pvVar11);
                    if (!bVar3) {
                      pvVar11 = std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)((long)&result.field_2 + 8));
                      local_448.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                      local_448.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                      local_448.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::vector(&local_448);
                      cmsys::SystemTools::FindProgram((string *)local_430,pvVar11,&local_448,false);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~vector(&local_448);
                      uVar12 = std::__cxx11::string::empty();
                      if ((uVar12 & 1) == 0) {
                        pvVar11 = std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)((long)&result.field_2 + 8));
                        std::__cxx11::string::operator=((string *)pvVar11,(string *)local_430);
                      }
                      else {
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)((long)&result.field_2 + 8));
                      }
                      std::__cxx11::string::~string((string *)local_430);
                    }
                  }
                  this = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)((long)&result.field_2 + 8);
                  iVar14 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::begin(this);
                  iVar15 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::end(this);
                  std::
                  for_each<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmSeparateArgumentsCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::__0>
                            (iVar14._M_current,iVar15._M_current);
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            (&local_490,";");
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            (&local_4a0);
                  cmJoin((string *)local_480,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)((long)&result.field_2 + 8),local_490,local_4a0);
                  pcVar8 = cmExecutionStatus::GetMakefile(local_20);
                  sVar1 = (string_view)
                          std::__cxx11::string::operator_cast_to_basic_string_view
                                    ((string *)local_480);
                  cmMakefile::AddDefinition(pcVar8,name,sVar1);
                  args_local._7_1_ = 1;
                  local_1e0 = 1;
                  std::__cxx11::string::~string((string *)local_480);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)((long)&result.field_2 + 8));
                }
                else {
                  std::__cxx11::string::string((string *)(programArgs.field_2._M_local_buf + 8));
                  std::__cxx11::string::string((string *)local_2c0);
                  local_2f0 = (string_view)
                              std::__cxx11::string::operator_cast_to_basic_string_view
                                        ((string *)pvVar11);
                  cmTrimWhitespace_abi_cxx11_(&local_2e0,local_2f0);
                  bVar4 = std::__cxx11::string::empty();
                  std::__cxx11::string::~string((string *)&local_2e0);
                  if (((bVar4 ^ 0xff) & 1) != 0) {
                    local_328.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    local_328.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    local_328.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::vector(&local_328);
                    cmsys::SystemTools::FindProgram(&local_310,pvVar11,&local_328,false);
                    std::__cxx11::string::operator=
                              ((string *)(programArgs.field_2._M_local_buf + 8),(string *)&local_310
                              );
                    std::__cxx11::string::~string((string *)&local_310);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&local_328);
                  }
                  uVar12 = std::__cxx11::string::empty();
                  if ((uVar12 & 1) != 0) {
                    bVar3 = cmSystemTools::SplitProgramFromArgs
                                      (pvVar11,(string *)((long)&programArgs.field_2 + 8),
                                       (string *)local_2c0);
                    if (bVar3) {
                      bVar3 = cmsys::SystemTools::FileExists
                                        ((string *)((long)&programArgs.field_2 + 8));
                      if (!bVar3) {
                        local_368.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                        local_368.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                        local_368.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::vector(&local_368);
                        cmsys::SystemTools::FindProgram
                                  (&local_348,(string *)((long)&programArgs.field_2 + 8),&local_368,
                                   false);
                        std::__cxx11::string::operator=
                                  ((string *)(programArgs.field_2._M_local_buf + 8),
                                   (string *)&local_348);
                        std::__cxx11::string::~string((string *)&local_348);
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::~vector(&local_368);
                      }
                    }
                  }
                  uVar12 = std::__cxx11::string::empty();
                  if ((uVar12 & 1) == 0) {
                    cmAlphaNum::cmAlphaNum(&local_3b8,';');
                    cmAlphaNum::cmAlphaNum(&local_3e8,(string *)local_2c0);
                    cmStrCat<>(&local_388,&local_3b8,&local_3e8);
                    std::__cxx11::string::operator+=
                              ((string *)(programArgs.field_2._M_local_buf + 8),(string *)&local_388
                              );
                    std::__cxx11::string::~string((string *)&local_388);
                  }
                  pcVar8 = cmExecutionStatus::GetMakefile(local_20);
                  sVar1 = (string_view)
                          std::__cxx11::string::operator_cast_to_basic_string_view
                                    ((string *)(programArgs.field_2._M_local_buf + 8));
                  cmMakefile::AddDefinition(pcVar8,name,sVar1);
                  args_local._7_1_ = 1;
                  local_1e0 = 1;
                  std::__cxx11::string::~string((string *)local_2c0);
                  std::__cxx11::string::~string((string *)(programArgs.field_2._M_local_buf + 8));
                }
              }
              else {
                pcVar8 = cmExecutionStatus::GetMakefile(local_20);
                sVar1 = (string_view)
                        std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar11);
                cmMakefile::AddDefinition(pcVar8,name,sVar1);
                args_local._7_1_ = 1;
                local_1e0 = 1;
              }
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_250,"given unexpected argument(s)",&local_251);
            cmExecutionStatus::SetError(pcVar2,&local_250);
            std::__cxx11::string::~string((string *)&local_250);
            std::allocator<char>::~allocator(&local_251);
            args_local._7_1_ = 0;
            local_1e0 = 1;
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_228,"`SEPARATE_ARGS` option requires `PROGRAM\' option",
                     &local_229);
          cmExecutionStatus::SetError(pcVar2,&local_228);
          std::__cxx11::string::~string((string *)&local_228);
          std::allocator<char>::~allocator(&local_229);
          args_local._7_1_ = 0;
          local_1e0 = 1;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_200,
                   "\'UNIX_COMMAND\', \'WINDOWS_COMMAND\' and \'NATIVE_COMMAND\' are mutually exclusive"
                   ,&local_201);
        cmExecutionStatus::SetError(pcVar2,&local_200);
        std::__cxx11::string::~string((string *)&local_200);
        std::allocator<char>::~allocator(&local_201);
        args_local._7_1_ = 0;
        local_1e0 = 1;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_190);
    }
  }
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool cmSeparateArgumentsCommand(std::vector<std::string> const& args,
                                cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("must be given at least one argument.");
    return false;
  }

  std::string const& var = args.front();

  if (args.size() == 1) {
    // Original space-replacement version of command.
    if (cmValue def = status.GetMakefile().GetDefinition(var)) {
      std::string value = *def;
      std::replace(value.begin(), value.end(), ' ', ';');
      status.GetMakefile().AddDefinition(var, value);
    }

    return true;
  }

  struct Arguments
  {
    bool UnixCommand = false;
    bool WindowsCommand = false;
    bool NativeCommand = false;
    bool Program = false;
    bool SeparateArgs = false;
  };

  static auto const parser =
    cmArgumentParser<Arguments>{}
      .Bind("UNIX_COMMAND"_s, &Arguments::UnixCommand)
      .Bind("WINDOWS_COMMAND"_s, &Arguments::WindowsCommand)
      .Bind("NATIVE_COMMAND"_s, &Arguments::NativeCommand)
      .Bind("PROGRAM"_s, &Arguments::Program)
      .Bind("SEPARATE_ARGS"_s, &Arguments::SeparateArgs);

  std::vector<std::string> unparsedArguments;
  Arguments arguments =
    parser.Parse(cmMakeRange(args).advance(1), &unparsedArguments);

  if (!arguments.UnixCommand && !arguments.WindowsCommand &&
      !arguments.NativeCommand) {
    status.SetError("missing required option: 'UNIX_COMMAND' or "
                    "'WINDOWS_COMMAND' or 'NATIVE_COMMAND'");
    return false;
  }
  if ((arguments.UnixCommand && arguments.WindowsCommand) ||
      (arguments.UnixCommand && arguments.NativeCommand) ||
      (arguments.WindowsCommand && arguments.NativeCommand)) {
    status.SetError("'UNIX_COMMAND', 'WINDOWS_COMMAND' and 'NATIVE_COMMAND' "
                    "are mutually exclusive");
    return false;
  }
  if (arguments.SeparateArgs && !arguments.Program) {
    status.SetError("`SEPARATE_ARGS` option requires `PROGRAM' option");
    return false;
  }

  if (unparsedArguments.size() > 1) {
    status.SetError("given unexpected argument(s)");
    return false;
  }

  if (unparsedArguments.empty()) {
    status.GetMakefile().AddDefinition(var, cm::string_view{});
    return true;
  }

  std::string& command = unparsedArguments.front();

  if (command.empty()) {
    status.GetMakefile().AddDefinition(var, command);
    return true;
  }

  if (arguments.Program && !arguments.SeparateArgs) {
    std::string program;
    std::string programArgs;

    // First assume the path to the program was specified with no
    // arguments and with no quoting or escaping for spaces.
    // Only bother doing this if there is non-whitespace.
    if (!cmTrimWhitespace(command).empty()) {
      program = cmSystemTools::FindProgram(command);
    }

    // If that failed then assume a command-line string was given
    // and split the program part from the rest of the arguments.
    if (program.empty()) {
      if (cmSystemTools::SplitProgramFromArgs(command, program, programArgs)) {
        if (!cmSystemTools::FileExists(program)) {
          program = cmSystemTools::FindProgram(program);
        }
      }
    }

    if (!program.empty()) {
      program += cmStrCat(';', programArgs);
    }

    status.GetMakefile().AddDefinition(var, program);
    return true;
  }

  // split command given
  std::vector<std::string> values;

  if (arguments.NativeCommand) {
#if defined(_WIN32)
    arguments.WindowsCommand = true;
#else
    arguments.UnixCommand = true;
#endif
  }

  if (arguments.UnixCommand) {
    cmSystemTools::ParseUnixCommandLine(command.c_str(), values);
  } else {
    cmSystemTools::ParseWindowsCommandLine(command.c_str(), values);
  }

  if (arguments.Program) {
    // check program exist
    if (!cmSystemTools::FileExists(values.front())) {
      auto result = cmSystemTools::FindProgram(values.front());
      if (result.empty()) {
        values.clear();
      } else {
        values.front() = result;
      }
    }
  }

  // preserve semicolons in arguments
  std::for_each(values.begin(), values.end(), [](std::string& value) {
    std::string::size_type pos = 0;
    while ((pos = value.find_first_of(';', pos)) != std::string::npos) {
      value.insert(pos, 1, '\\');
      pos += 2;
    }
  });
  auto value = cmJoin(values, ";");
  status.GetMakefile().AddDefinition(var, value);

  return true;
}